

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

float __thiscall SVGChart::LogTickIterator::RoundDown(LogTickIterator *this,float inFloat)

{
  float __x;
  float fVar1;
  float fVar2;
  double dVar3;
  
  __x = ((this->super_TickIterator).mAxisSetup)->mLogBase;
  fVar1 = 1e-10;
  if (1e-10 <= inFloat) {
    fVar1 = inFloat;
  }
  fVar1 = log10f(fVar1);
  fVar2 = log10f(__x);
  fVar1 = floorf(fVar1 / fVar2);
  dVar3 = pow((double)__x,(double)(int)fVar1);
  return (float)dVar3;
}

Assistant:

float LogTickIterator::RoundDown (float inFloat) const {
      float theBase = mAxisSetup->mLogBase;
      long theLogFac = 1;//mAxisSetup->mLogFactor;
      int thePow = (int)floor(SafeLog(inFloat,theBase, theLogFac));
      return pow (theBase, thePow);
    }